

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

int * Gia_AigerReadMapping(uchar **ppPos,int nSize)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  int local_40;
  uint local_3c;
  int iOffset;
  int iNode;
  int nAlloc;
  int nFanins;
  int j;
  int k;
  uchar *pStop;
  int *pMapping;
  int nSize_local;
  uchar **ppPos_local;
  
  local_3c = 0;
  puVar1 = *ppPos;
  iVar2 = Gia_AigerReadInt(*ppPos);
  *ppPos = *ppPos + 4;
  iVar3 = ((int)(puVar1 + iVar2) + nSize) - (int)*ppPos;
  piVar5 = (int *)calloc((long)iVar3,4);
  local_40 = nSize;
  while (*ppPos < puVar1 + iVar2) {
    uVar4 = Gia_AigerReadUnsigned(ppPos);
    piVar5[local_40] = uVar4;
    nFanins = local_40;
    for (nAlloc = 0; nFanins = nFanins + 1, nAlloc <= (int)uVar4; nAlloc = nAlloc + 1) {
      local_3c = Gia_AigerReadDiffValue(ppPos,local_3c);
      piVar5[nFanins] = local_3c;
    }
    piVar5[(int)local_3c] = local_40;
    local_40 = nFanins;
  }
  if (local_40 <= iVar3) {
    return piVar5;
  }
  __assert_fail("iOffset <= nAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                ,0xa1,"int *Gia_AigerReadMapping(unsigned char **, int)");
}

Assistant:

int * Gia_AigerReadMapping( unsigned char ** ppPos, int nSize )
{
    int * pMapping;
    unsigned char * pStop;
    int k, j, nFanins, nAlloc, iNode = 0, iOffset = nSize;
    pStop = *ppPos;
    pStop += Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    nAlloc = nSize + pStop - *ppPos;
    pMapping = ABC_CALLOC( int, nAlloc );
    while ( *ppPos < pStop )
    {
        k = iOffset;
        pMapping[k++] = nFanins = Gia_AigerReadUnsigned( ppPos );
        for ( j = 0; j <= nFanins; j++ )
            pMapping[k++] = iNode = Gia_AigerReadDiffValue( ppPos, iNode );
        pMapping[iNode] = iOffset;
        iOffset = k;
    }
    assert( iOffset <= nAlloc );
    return pMapping;
}